

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O1

bool polyscope::view::viewIsValid(void)

{
  bool bVar1;
  int j;
  int iVar2;
  int i;
  long lVar3;
  uint *puVar4;
  
  bVar1 = true;
  lVar3 = 0;
  do {
    iVar2 = 0;
    do {
      puVar4 = (uint *)((long)&DAT_006006ac + lVar3 * 0x10 + 4);
      if (((iVar2 != 3) && (puVar4 = (uint *)(&DAT_006006ac + lVar3 * 2), iVar2 != 2)) &&
         (puVar4 = &viewMat + lVar3 * 4, iVar2 == 1)) {
        puVar4 = (uint *)(&DAT_006006a8 + lVar3 * 0x10);
      }
      if (0x7f7fffff < (*puVar4 & 0x7fffffff)) {
        bVar1 = false;
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  return bVar1;
}

Assistant:

bool viewIsValid() {
  bool allFinite = true;
  for (int i = 0; i < 4; i++) {
    for (int j = 0; j < 4; j++) {
      if (!std::isfinite(viewMat[i][j])) {
        allFinite = false;
      }
    }
  }
  return allFinite;
}